

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0)

{
  bool bVar1;
  uchar local_21;
  RegSlot local_20;
  OpCode OStack_1a;
  OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = R0;
  OStack_1a = op;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&local_21,R0);
  if (bVar1) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,OStack_1a,&local_21,1,this);
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg1(OpCode op, RegSlot R0)
    {
        OpLayoutT_Reg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }